

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_get(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue key_00;
  void *pvVar1;
  JSMapRecord *pJVar2;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue key;
  JSMapRecord *mr;
  JSMapState *s;
  JSValueUnion local_70;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion in_stack_ffffffffffffffb0;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar3.tag = (int64_t)in_stack_ffffffffffffffb0.ptr;
  JVar3.u.float64 = in_stack_ffffffffffffffa8.float64;
  pvVar1 = JS_GetOpaque2(in_stack_ffffffffffffffa0,JVar3,local_70._12_4_);
  if (pvVar1 == (void *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    JVar3 = map_normalize_key(in_RDI,*in_R8);
    local_70 = JVar3.u;
    key_00.tag = (int64_t)pvVar1;
    key_00.u.ptr = in_stack_ffffffffffffffb0.ptr;
    pJVar2 = map_find_record((JSContext *)JVar3.tag,(JSMapState *)local_70.ptr,key_00);
    if (pJVar2 == (JSMapRecord *)0x0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 3;
    }
    else {
      _local_10 = JS_DupValue(in_RDI,pJVar2->value);
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_map_get(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    if (!mr)
        return JS_UNDEFINED;
    else
        return JS_DupValue(ctx, mr->value);
}